

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall
google::protobuf::DescriptorBuilder::ValidateFieldOptions
          (DescriptorBuilder *this,FieldDescriptor *field,FieldDescriptorProto *proto)

{
  string *psVar1;
  MessageOptions *pMVar2;
  bool bVar3;
  long lVar4;
  MessageOptions *pMVar5;
  allocator<char> local_41;
  string local_40;
  
  lVar4 = *(long *)(field + 0x60);
  if ((*(byte *)(lVar4 + 0x6c) & 0x10) != 0) {
    ValidateMapKey(this,field,proto);
    lVar4 = *(long *)(field + 0x60);
  }
  if ((*(char *)(lVar4 + 0x45) == '\x01') && (*(int *)(field + 0x2c) != 0xb)) {
    psVar1 = *(string **)(field + 8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"[lazy = true] can only be specified for submessage fields.",
               &local_41);
    AddError(this,psVar1,&proto->super_Message,TYPE,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    lVar4 = *(long *)(field + 0x60);
  }
  if ((*(char *)(lVar4 + 0x44) == '\x01') &&
     ((*(int *)(field + 0x30) != 3 || (0xfffffffb < *(int *)(field + 0x2c) - 0xdU)))) {
    psVar1 = *(string **)(field + 8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,
               "[packed = true] can only be specified for repeated primitive fields.",&local_41);
    AddError(this,psVar1,&proto->super_Message,TYPE,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
  }
  if (*(long *)(field + 0x38) != 0) {
    pMVar2 = *(MessageOptions **)(*(long *)(field + 0x38) + 0x20);
    pMVar5 = MessageOptions::default_instance();
    if ((pMVar2 != pMVar5) &&
       (*(char *)(*(long *)(*(long *)(field + 0x38) + 0x20) + 0x58) == '\x01')) {
      if (field[0x34] == (FieldDescriptor)0x1) {
        if ((*(int *)(field + 0x30) == 1) && (*(int *)(field + 0x2c) == 0xb)) goto LAB_001e69bb;
        psVar1 = *(string **)(field + 8);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_40,"Extensions of MessageSets must be optional messages.",
                   &local_41);
        AddError(this,psVar1,&proto->super_Message,TYPE,&local_40);
      }
      else {
        psVar1 = *(string **)(field + 8);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_40,"MessageSets cannot have fields, only extensions.",&local_41)
        ;
        AddError(this,psVar1,&proto->super_Message,NAME,&local_40);
      }
      std::__cxx11::string::~string((string *)&local_40);
    }
  }
LAB_001e69bb:
  bVar3 = IsLite(*(FileDescriptor **)(field + 0x20));
  if ((bVar3) && (*(long *)(field + 0x38) != 0)) {
    bVar3 = IsLite(*(FileDescriptor **)(*(long *)(field + 0x38) + 0x10));
    if (!bVar3) {
      psVar1 = *(string **)(field + 8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_40,
                 "Extensions to non-lite types can only be declared in non-lite files.  Note that you cannot extend a non-lite type to contain a lite type, but the reverse is allowed."
                 ,&local_41);
      AddError(this,psVar1,&proto->super_Message,EXTENDEE,&local_40);
      std::__cxx11::string::~string((string *)&local_40);
    }
  }
  return;
}

Assistant:

void DescriptorBuilder::ValidateFieldOptions(FieldDescriptor* field,
    const FieldDescriptorProto& proto) {
  if (field->options().has_experimental_map_key()) {
    ValidateMapKey(field, proto);
  }

  // Only message type fields may be lazy.
  if (field->options().lazy()) {
    if (field->type() != FieldDescriptor::TYPE_MESSAGE) {
      AddError(field->full_name(), proto,
               DescriptorPool::ErrorCollector::TYPE,
               "[lazy = true] can only be specified for submessage fields.");
    }
  }

  // Only repeated primitive fields may be packed.
  if (field->options().packed() && !field->is_packable()) {
    AddError(
      field->full_name(), proto,
      DescriptorPool::ErrorCollector::TYPE,
      "[packed = true] can only be specified for repeated primitive fields.");
  }

  // Note:  Default instance may not yet be initialized here, so we have to
  //   avoid reading from it.
  if (field->containing_type_ != NULL &&
      &field->containing_type()->options() !=
      &MessageOptions::default_instance() &&
      field->containing_type()->options().message_set_wire_format()) {
    if (field->is_extension()) {
      if (!field->is_optional() ||
          field->type() != FieldDescriptor::TYPE_MESSAGE) {
        AddError(field->full_name(), proto,
                 DescriptorPool::ErrorCollector::TYPE,
                 "Extensions of MessageSets must be optional messages.");
      }
    } else {
      AddError(field->full_name(), proto,
               DescriptorPool::ErrorCollector::NAME,
               "MessageSets cannot have fields, only extensions.");
    }
  }

  // Lite extensions can only be of Lite types.
  if (IsLite(field->file()) &&
      field->containing_type_ != NULL &&
      !IsLite(field->containing_type()->file())) {
    AddError(field->full_name(), proto,
             DescriptorPool::ErrorCollector::EXTENDEE,
             "Extensions to non-lite types can only be declared in non-lite "
             "files.  Note that you cannot extend a non-lite type to contain "
             "a lite type, but the reverse is allowed.");
  }

}